

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_ArriveAndWait_Test::TestBody(BarrierTest_ArriveAndWait_Test *this)

{
  bool bVar1;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  barrier<yamc::detail::default_barrier_completion> barrier;
  
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&barrier,1);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c0 = 0;
  local_c8 = &local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_wait(&barrier);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c0 = 0;
  local_c8 = &local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_wait(&barrier);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::condition_variable::~condition_variable(&barrier.cv_);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndWait)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.arrive_and_wait());
  EXPECT_NO_THROW(barrier.arrive_and_wait());
}